

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O0

X509_EXTENSION *
X509_EXTENSION_create_by_NID(X509_EXTENSION **ex,int nid,int crit,ASN1_OCTET_STRING *data)

{
  ASN1_OBJECT *obj_00;
  X509_EXTENSION *ret;
  ASN1_OBJECT *obj;
  ASN1_OCTET_STRING *data_local;
  int crit_local;
  int nid_local;
  X509_EXTENSION **ex_local;
  
  obj_00 = OBJ_nid2obj(nid);
  if (obj_00 == (ASN1_OBJECT *)0x0) {
    ERR_put_error(0xb,0,0x81,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_v3.cc"
                  ,0x9a);
    ex_local = (X509_EXTENSION **)0x0;
  }
  else {
    ex_local = (X509_EXTENSION **)X509_EXTENSION_create_by_OBJ(ex,obj_00,crit,data);
  }
  return (X509_EXTENSION *)ex_local;
}

Assistant:

X509_EXTENSION *X509_EXTENSION_create_by_NID(X509_EXTENSION **ex, int nid,
                                             int crit,
                                             const ASN1_OCTET_STRING *data) {
  const ASN1_OBJECT *obj;
  X509_EXTENSION *ret;

  obj = OBJ_nid2obj(nid);
  if (obj == NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_UNKNOWN_NID);
    return NULL;
  }
  ret = X509_EXTENSION_create_by_OBJ(ex, obj, crit, data);
  return ret;
}